

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

FederateInfo * helics::loadFederateInfo(string *configString)

{
  string_view configString_00;
  ConfigType CVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  FederateInfo *in_RSI;
  FederateInfo *in_RDI;
  InvalidParameter *anon_var_0_1;
  InvalidParameter *anon_var_0_2;
  InvalidParameter *anon_var_0;
  ConfigType type;
  FederateInfo *ret;
  undefined1 in_stack_00000617;
  string *in_stack_00000618;
  FederateInfo *in_stack_00000620;
  undefined1 in_stack_000007c7;
  string *in_stack_000007c8;
  FederateInfo *in_stack_000007d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff98;
  FederateInfo *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  FederateInfo::FederateInfo(in_RSI);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff60);
  configString_00._M_str = in_stack_ffffffffffffffa8;
  configString_00._M_len = (size_t)in_stack_ffffffffffffffa0;
  CVar1 = fileops::getConfigType(configString_00);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)CVar1;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    FederateInfo::loadInfoFromJson(in_stack_000007d0,in_stack_000007c8,(bool)in_stack_000007c7);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_ffffffffffffff58);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    in_RDI->fileInUse = true;
    FederateInfo::loadInfoFromJson(in_stack_000007d0,in_stack_000007c8,(bool)in_stack_000007c7);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_ffffffffffffff58);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    FederateInfo::loadInfoFromToml(in_stack_00000620,in_stack_00000618,(bool)in_stack_00000617);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_ffffffffffffff58);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    in_RDI->fileInUse = true;
    FederateInfo::loadInfoFromToml(in_stack_00000620,in_stack_00000618,(bool)in_stack_00000617);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_ffffffffffffff58);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    FederateInfo::loadInfoFromArgsIgnoreOutput(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

FederateInfo loadFederateInfo(const std::string& configString)
{
    FederateInfo ret;
    auto type = fileops::getConfigType(configString);
    switch (type) {
        case fileops::ConfigType::JSON_FILE:
            ret.fileInUse = true;
            ret.loadInfoFromJson(configString);
            ret.configString = configString;
            break;
        case fileops::ConfigType::JSON_STRING:
            try {
                ret.loadInfoFromJson(configString);
                ret.configString = configString;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeConfigToml(configString)) {
                    try {
                        ret.loadInfoFromToml(configString);
                        ret.configString = configString;
                    }
                    catch (const helics::InvalidParameter&) {
                        if (fileops::looksLikeCommandLine(configString)) {
                            ret.loadInfoFromArgsIgnoreOutput(configString);
                            break;
                        }
                        throw;
                    }
                }
                throw;
            }
            break;
        case fileops::ConfigType::TOML_FILE:
            ret.fileInUse = true;
            ret.loadInfoFromToml(configString);
            ret.configString = configString;
            break;
        case fileops::ConfigType::TOML_STRING:
            try {
                ret.loadInfoFromToml(configString);
                ret.configString = configString;
            }
            catch (const helics::InvalidParameter&) {
                if (fileops::looksLikeCommandLine(configString)) {
                    ret.loadInfoFromArgsIgnoreOutput(configString);
                    break;
                }
                throw;
            }
            break;
        case fileops::ConfigType::CMD_LINE:
            ret.loadInfoFromArgsIgnoreOutput(configString);
            break;
        case fileops::ConfigType::NONE:
            ret.defName = configString;
    }

    return ret;
}